

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O1

void __thiscall
miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>
          (Node<unsigned_int> *this,KeyParser *ctx)

{
  MaxInt<unsigned_int> *pMVar1;
  MaxInt<unsigned_int> MVar2;
  MaxInt<unsigned_int> MVar3;
  pointer poVar4;
  pointer poVar5;
  bool bVar6;
  bool bVar7;
  unsigned_long __tmp_1;
  MaxInt<unsigned_int> MVar8;
  long lVar9;
  ulong uVar10;
  MaxInt<unsigned_int> *pMVar11;
  DummyState *in_RCX;
  MaxInt<unsigned_int> *pMVar12;
  _Rb_tree_node_base *__tmp;
  ulong uVar13;
  long lVar14;
  MaxInt<unsigned_int> MVar15;
  _Rb_tree_node_base *p_Var16;
  _Self __tmp_2;
  MaxInt<unsigned_int> MVar17;
  _Rb_tree_impl<Comp,_false> *__src_impl;
  MaxInt<unsigned_int> *pMVar18;
  MaxInt<unsigned_int> *pMVar19;
  ulong uVar20;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar21;
  vector<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
  results;
  vector<StackElem,_std::allocator<StackElem>_> stack;
  vector<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
  local_198;
  void *local_178;
  void *pvStack_170;
  long local_168;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_Comp,_std::allocator<unsigned_int>_>
  local_158;
  MaxInt<unsigned_int> local_128;
  undefined4 local_120 [2];
  MaxInt<unsigned_int> local_118;
  MaxInt<unsigned_int> local_110;
  MaxInt<unsigned_int> MStack_108;
  MaxInt<unsigned_int> local_100;
  char local_f8;
  MaxInt<unsigned_int> local_f0;
  undefined4 local_e8 [2];
  MaxInt<unsigned_int> local_e0;
  MaxInt<unsigned_int> local_d8;
  MaxInt<unsigned_int> MStack_d0;
  MaxInt<unsigned_int> local_c8;
  char local_c0;
  char local_b8;
  MaxInt<unsigned_int> local_b0;
  _Rb_tree_color local_a8 [2];
  MaxInt<unsigned_int> local_a0;
  MaxInt<unsigned_int> local_98;
  MaxInt<unsigned_int> MStack_90;
  MaxInt<unsigned_int> local_88;
  char local_80;
  char local_78;
  MaxInt<unsigned_int> local_70;
  _Rb_tree_color local_68 [2];
  MaxInt<unsigned_int> local_60;
  MaxInt<unsigned_int> local_58;
  MaxInt<unsigned_int> MStack_50;
  MaxInt<unsigned_int> local_48;
  char local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_168 = 0;
  local_178 = (void *)0x0;
  pvStack_170 = (void *)0x0;
  local_198.
  super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_198.
  super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_198.
  super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b0 = (MaxInt<unsigned_int>)((ulong)local_b0 & 0xffffffff00000000);
  std::
  vector<miniscript::Node<unsigned_int>::TreeEvalMaybe<std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::Comp,std::allocator<unsigned_int>>>,miniscript::Node<unsigned_int>::TreeEval<std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::Comp,std::allocator<unsigned_int>>>,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::{lambda(miniscript::Node<unsigned_int>const&,Span<std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>(auto:1_const&)const::Comp,std::allocator<unsigned_int>>>>)#1}>(miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::{lamb...espace)::KeyParser>(auto:1_const&)const::Comp,std::allocator<unsigned_int>>>>)#1})const::StackElem>>
  ::
  emplace_back<miniscript::Node<unsigned_int>const&,int,miniscript::Node<unsigned_int>::TreeEval<std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::Comp,std::allocator<unsigned_int>>>,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::_lambda(miniscript::Node<unsigned_int>const&,Span<std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>(auto:1_const&)const::Comp,std::allocator<unsigned_int>>>>)_1_>(miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::_lambda(miniscript::Node<unsigned_int>const&,Span<std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>(auto:1_const&)const::Comp,std::allocator<unsigned_int>>>>)_1_)const::DummyState>
            ((vector<miniscript::Node<unsigned_int>::TreeEvalMaybe<std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::Comp,std::allocator<unsigned_int>>>,miniscript::Node<unsigned_int>::TreeEval<std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::Comp,std::allocator<unsigned_int>>>,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::_lambda(miniscript::Node<unsigned_int>const&,Span<std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>(auto:1_const&)const::Comp,std::allocator<unsigned_int>>>>)_1_>(miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::_lamb___espace)::KeyParser>(auto:1_const&)const::Comp,std::allocator<unsigned_int>>>>__1__const__StackElem>>
              *)&local_178,this,(int *)&local_b0,in_RCX);
  do {
    poVar4 = local_198.
             super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pvStack_170 == local_178) {
      if ((long)local_198.
                super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_198.
                super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start != 0x38) goto LAB_0071fe18;
      local_c0 = '\0';
      if (((MaxInt<unsigned_int> *)
          ((long)local_198.
                 super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 0x30))->valid == true) {
        local_f0 = *(MaxInt<unsigned_int> *)
                    local_198.
                    super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        local_d8 = (MaxInt<unsigned_int>)local_e8;
        local_e0 = *(MaxInt<unsigned_int> *)
                    ((long)local_198.
                           super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + 0x10);
        if (local_e0 == (MaxInt<unsigned_int>)0x0) {
          pMVar18 = &local_c8;
          local_e8[0] = 0;
          local_e0.valid = false;
          local_e0._1_3_ = 0;
          local_e0.value = 0;
          MStack_d0 = local_d8;
        }
        else {
          this = (Node<unsigned_int> *)
                 ((long)local_198.
                        super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + 8);
          local_e8[0] = *(undefined4 *)
                         ((long)local_198.
                                super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + 8);
          MVar2 = *(MaxInt<unsigned_int> *)
                   ((long)local_198.
                          super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 0x18);
          MStack_d0 = *(MaxInt<unsigned_int> *)
                       ((long)local_198.
                              super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + 0x20);
          *(MaxInt<unsigned_int> *)((long)local_e0 + 8) = local_d8;
          pMVar18 = (MaxInt<unsigned_int> *)
                    ((long)local_198.
                           super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + 0x28);
          local_c8 = *(MaxInt<unsigned_int> *)
                      ((long)local_198.
                             super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + 0x28);
          *(bool *)((long)&((local_198.
                             super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                           )._M_payload.
                           super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                           .
                           super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                           ._M_payload + 0x10) = false;
          *(undefined3 *)
           ((long)&((local_198.
                     super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                   )._M_payload.
                   super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                   ._M_payload + 0x11) = 0;
          *(uint *)((long)&((local_198.
                             super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                           )._M_payload.
                           super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                           .
                           super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                           ._M_payload + 0x14) = 0;
          *(Node<unsigned_int> **)
           ((long)local_198.
                  super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 0x18) = this;
          *(Node<unsigned_int> **)
           ((long)local_198.
                  super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 0x20) = this;
          local_d8 = MVar2;
        }
        pMVar18->valid = false;
        *(undefined3 *)&pMVar18->field_0x1 = 0;
        pMVar18->value = 0;
        local_c0 = '\x01';
      }
      local_b8 = '\x01';
      break;
    }
    lVar9 = *(long *)((long)pvStack_170 + -0x18);
    uVar10 = *(ulong *)((long)pvStack_170 + -0x10);
    lVar14 = *(long *)(lVar9 + 0x38);
    MVar2 = *(MaxInt<unsigned_int> *)(lVar9 + 0x40);
    uVar13 = (long)MVar2 - lVar14 >> 4;
    if (uVar10 < uVar13) {
      *(ulong *)((long)pvStack_170 + -0x10) = uVar10 + 1;
      this = *(Node<unsigned_int> **)((DummyState *)(uVar10 * 0x10) + lVar14);
      local_b0 = (MaxInt<unsigned_int>)((ulong)local_b0 & 0xffffffff00000000);
      std::
      vector<miniscript::Node<unsigned_int>::TreeEvalMaybe<std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::Comp,std::allocator<unsigned_int>>>,miniscript::Node<unsigned_int>::TreeEval<std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::Comp,std::allocator<unsigned_int>>>,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::{lambda(miniscript::Node<unsigned_int>const&,Span<std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>(auto:1_const&)const::Comp,std::allocator<unsigned_int>>>>)#1}>(miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::{lamb...espace)::KeyParser>(auto:1_const&)const::Comp,std::allocator<unsigned_int>>>>)#1})const::StackElem>>
      ::
      emplace_back<miniscript::Node<unsigned_int>const&,int,miniscript::Node<unsigned_int>::TreeEval<std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::Comp,std::allocator<unsigned_int>>>,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::_lambda(miniscript::Node<unsigned_int>const&,Span<std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>(auto:1_const&)const::Comp,std::allocator<unsigned_int>>>>)_1_>(miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::_lambda(miniscript::Node<unsigned_int>const&,Span<std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>(auto:1_const&)const::Comp,std::allocator<unsigned_int>>>>)_1_)const::DummyState>
                ((vector<miniscript::Node<unsigned_int>::TreeEvalMaybe<std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::Comp,std::allocator<unsigned_int>>>,miniscript::Node<unsigned_int>::TreeEval<std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::Comp,std::allocator<unsigned_int>>>,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::_lambda(miniscript::Node<unsigned_int>const&,Span<std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>(auto:1_const&)const::Comp,std::allocator<unsigned_int>>>>)_1_>(miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::_lamb___espace)::KeyParser>(auto:1_const&)const::Comp,std::allocator<unsigned_int>>>>__1__const__StackElem>>
                  *)&local_178,this,(int *)&local_b0,(DummyState *)(uVar10 * 0x10));
      bVar6 = false;
    }
    else {
      if ((ulong)(((long)local_198.
                         super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_198.
                         super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7) <
          uVar13) {
        __assert_fail("results.size() >= node.subs.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.h"
                      ,0x273,
                      "std::optional<Result> miniscript::Node<unsigned int>::TreeEvalMaybe(State, DownFn, UpFn) const [Key = unsigned int, Result = std::optional<std::set<unsigned int, Comp>>, State = DummyState, DownFn = (lambda at /workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.h:678:13), UpFn = (lambda at /workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.h:679:13)]"
                     );
      }
      MVar8 = *(MaxInt<unsigned_int> *)(lVar9 + 0x38);
      this = (Node<unsigned_int> *)MVar8;
      if ((*(char *)(lVar9 + 0xa1) == '\x01') && (*(char *)(lVar9 + 0xa0) == '\x01')) {
LAB_0071f34c:
        local_40 = '\0';
      }
      else {
        lVar14 = (long)MVar2 - (long)MVar8 >> 4;
        pMVar18 = (MaxInt<unsigned_int> *)
                  ((long)local_198.
                         super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start +
                  lVar14 * -0x38 +
                  ((long)local_198.
                         super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_198.
                        super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start));
        if (MVar2 != MVar8) {
          if (pMVar18[6].valid == true) {
            pMVar19 = (MaxInt<unsigned_int> *)
                      ((long)local_198.
                             super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish + lVar14 * -7 * 8);
            do {
              if (pMVar19 + 7 ==
                  (MaxInt<unsigned_int> *)
                  local_198.
                  super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) goto LAB_0071f359;
              pMVar1 = pMVar19 + 0xd;
              pMVar19 = pMVar19 + 7;
            } while (pMVar1->valid != false);
          }
          *(undefined2 *)(lVar9 + 0xa0) = 0x101;
          goto LAB_0071f34c;
        }
LAB_0071f359:
        MVar17 = *(MaxInt<unsigned_int> *)(lVar9 + 8);
        MVar3 = *(MaxInt<unsigned_int> *)(lVar9 + 0x10);
        local_158._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_158._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_158._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_158._M_impl.super__Rb_tree_header._M_header;
        local_158._M_impl.super__Rb_tree_header._M_node_count._0_1_ = false;
        local_158._M_impl.super__Rb_tree_header._M_node_count._1_3_ = 0;
        local_158._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
        lVar14 = (long)MVar3 - (long)MVar17;
        local_158._M_impl.super__Rb_tree_key_compare<Comp>._M_key_compare.ctx_ptr = (Comp)(Comp)ctx;
        local_158._M_impl.super__Rb_tree_header._M_header._M_right =
             local_158._M_impl.super__Rb_tree_header._M_header._M_left;
        if (lVar14 != 0) {
          do {
            if ((MaxInt<unsigned_int>)local_158._M_impl.super__Rb_tree_header._M_node_count ==
                (MaxInt<unsigned_int>)0x0) {
LAB_0071f3ee:
              this = (Node<unsigned_int> *)MVar17;
              pVar21 = std::
                       _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_Comp,_std::allocator<unsigned_int>_>
                       ::_M_get_insert_unique_pos(&local_158,(key_type_conflict1 *)MVar17);
              MVar15 = (MaxInt<unsigned_int>)pVar21.second;
              bVar6 = pVar21.first != (_Rb_tree_node_base *)0x0;
            }
            else {
              this = (Node<unsigned_int> *)
                     ((long)local_158._M_impl.super__Rb_tree_header._M_header._M_right + 0x20);
              bVar6 = DuplicateKeyCheck<(anonymous_namespace)::KeyParser>::Comp::operator()
                                ((Comp *)&local_158,(uint *)this,(uint *)MVar17);
              if (!bVar6) goto LAB_0071f3ee;
              bVar6 = false;
              MVar15 = (MaxInt<unsigned_int>)
                       local_158._M_impl.super__Rb_tree_header._M_header._M_right;
            }
            if (MVar15 != (MaxInt<unsigned_int>)0x0) {
              bVar7 = true;
              if (!bVar6 && (MaxInt<unsigned_int>)&local_158._M_impl.super__Rb_tree_header != MVar15
                 ) {
                bVar7 = DuplicateKeyCheck<(anonymous_namespace)::KeyParser>::Comp::operator()
                                  ((Comp *)&local_158,(uint *)MVar17,(uint *)((long)MVar15 + 0x20));
              }
              this = (Node<unsigned_int> *)operator_new(0x28);
              *(undefined4 *)
               &(((vector<unsigned_char,_std::allocator<unsigned_char>_> *)((long)this + 0x20))->
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start = *(undefined4 *)MVar17;
              std::_Rb_tree_insert_and_rebalance
                        (bVar7,(_Rb_tree_node_base *)this,(_Rb_tree_node_base *)MVar15,
                         (_Rb_tree_node_base *)&local_158._M_impl.super__Rb_tree_header);
              local_158._M_impl.super__Rb_tree_header._M_node_count =
                   local_158._M_impl.super__Rb_tree_header._M_node_count + 1;
            }
            MVar17 = (MaxInt<unsigned_int>)((long)MVar17 + 4);
          } while (MVar17 != MVar3);
        }
        MVar17 = (MaxInt<unsigned_int>)(lVar14 >> 2);
        if ((MaxInt<unsigned_int>)local_158._M_impl.super__Rb_tree_header._M_node_count == MVar17) {
          if (MVar2 != MVar8) {
            do {
              MVar2 = pMVar18[5];
              if (local_158._M_impl.super__Rb_tree_header._M_node_count < (ulong)MVar2) {
                MVar8 = pMVar18[2];
                if ((MaxInt<unsigned_int>)
                    local_158._M_impl.super__Rb_tree_header._M_header._M_parent ==
                    (MaxInt<unsigned_int>)0x0) {
                  if (MVar8 != (MaxInt<unsigned_int>)0x0) {
                    local_158._M_impl.super__Rb_tree_header._M_header._M_color =
                         *(_Rb_tree_color *)(pMVar18 + 1);
                    local_158._M_impl.super__Rb_tree_header._M_header._M_left =
                         *(_Base_ptr *)(pMVar18 + 3);
                    local_158._M_impl.super__Rb_tree_header._M_header._M_right =
                         *(_Base_ptr *)(pMVar18 + 4);
                    *(_Rb_tree_header **)&((_Rb_tree_header *)((long)MVar8 + 8))->_M_header =
                         &local_158._M_impl.super__Rb_tree_header;
                    pMVar18[2].valid = false;
                    *(undefined3 *)&pMVar18[2].field_0x1 = 0;
                    pMVar18[2].value = 0;
                    pMVar18[3] = (MaxInt<unsigned_int>)(pMVar18 + 1);
                    pMVar18[4] = (MaxInt<unsigned_int>)(pMVar18 + 1);
                    pMVar18[5].valid = false;
                    *(undefined3 *)&pMVar18[5].field_0x1 = 0;
                    pMVar18[5].value = 0;
                    local_158._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)MVar8;
                    local_158._M_impl.super__Rb_tree_header._M_node_count = (size_t)MVar2;
                  }
                }
                else if (MVar8 == (MaxInt<unsigned_int>)0x0) {
                  this._4_4_ = 0;
                  this._0_4_ = local_158._M_impl.super__Rb_tree_header._M_header._M_color;
                  *(_Rb_tree_color *)(pMVar18 + 1) =
                       local_158._M_impl.super__Rb_tree_header._M_header._M_color;
                  pMVar18[2] = (MaxInt<unsigned_int>)
                               local_158._M_impl.super__Rb_tree_header._M_header._M_parent;
                  pMVar18[3] = (MaxInt<unsigned_int>)
                               local_158._M_impl.super__Rb_tree_header._M_header._M_left;
                  pMVar18[4] = (MaxInt<unsigned_int>)
                               local_158._M_impl.super__Rb_tree_header._M_header._M_right;
                  *(MaxInt<unsigned_int> **)
                   &((_Rb_tree_header *)
                    ((long)local_158._M_impl.super__Rb_tree_header._M_header._M_parent + 8))->
                    _M_header = pMVar18 + 1;
                  pMVar18[5].valid =
                       (bool)(undefined1)local_158._M_impl.super__Rb_tree_header._M_node_count;
                  *(undefined3 *)&pMVar18[5].field_0x1 =
                       local_158._M_impl.super__Rb_tree_header._M_node_count._1_3_;
                  pMVar18[5].value = local_158._M_impl.super__Rb_tree_header._M_node_count._4_4_;
                  local_158._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                  local_158._M_impl.super__Rb_tree_header._M_header._M_left =
                       &local_158._M_impl.super__Rb_tree_header._M_header;
                  local_158._M_impl.super__Rb_tree_header._M_node_count._0_1_ = false;
                  local_158._M_impl.super__Rb_tree_header._M_node_count._1_3_ = 0;
                  local_158._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
                  local_158._M_impl.super__Rb_tree_header._M_header._M_right =
                       local_158._M_impl.super__Rb_tree_header._M_header._M_left;
                }
                else {
                  pMVar18[2] = (MaxInt<unsigned_int>)
                               local_158._M_impl.super__Rb_tree_header._M_header._M_parent;
                  MVar3 = pMVar18[3];
                  pMVar18[3] = (MaxInt<unsigned_int>)
                               local_158._M_impl.super__Rb_tree_header._M_header._M_left;
                  this = *(Node<unsigned_int> **)(pMVar18 + 4);
                  pMVar18[4] = (MaxInt<unsigned_int>)
                               local_158._M_impl.super__Rb_tree_header._M_header._M_right;
                  *(_Rb_tree_header **)&((_Rb_tree_header *)((long)MVar8 + 8))->_M_header =
                       &local_158._M_impl.super__Rb_tree_header;
                  *(MaxInt<unsigned_int> **)((long)pMVar18[2] + 8) = pMVar18 + 1;
                  pMVar18[5].valid =
                       (bool)(undefined1)local_158._M_impl.super__Rb_tree_header._M_node_count;
                  *(undefined3 *)&pMVar18[5].field_0x1 =
                       local_158._M_impl.super__Rb_tree_header._M_node_count._1_3_;
                  pMVar18[5].value = local_158._M_impl.super__Rb_tree_header._M_node_count._4_4_;
                  local_158._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)MVar8;
                  local_158._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)MVar3;
                  local_158._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)this;
                  local_158._M_impl.super__Rb_tree_header._M_node_count = (size_t)MVar2;
                }
                MVar8 = *pMVar18;
                *pMVar18 = (MaxInt<unsigned_int>)
                           local_158._M_impl.super__Rb_tree_key_compare<Comp>._M_key_compare.ctx_ptr
                ;
                local_158._M_impl.super__Rb_tree_key_compare<Comp>._M_key_compare.ctx_ptr =
                     (Comp)(Comp)MVar8;
              }
              MVar8 = pMVar18[3];
              while (MVar3 = MVar8, MVar3 != (MaxInt<unsigned_int>)(pMVar18 + 1)) {
                MVar8 = (MaxInt<unsigned_int>)std::_Rb_tree_increment((_Rb_tree_node_base *)MVar3);
                this = (Node<unsigned_int> *)((long)MVar3 + 0x20);
                pVar21 = std::
                         _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_Comp,_std::allocator<unsigned_int>_>
                         ::_M_get_insert_unique_pos(&local_158,(key_type_conflict1 *)this);
                p_Var16 = pVar21.second;
                if (p_Var16 != (_Rb_tree_node_base *)0x0) {
                  this = (Node<unsigned_int> *)
                         std::_Rb_tree_rebalance_for_erase
                                   ((_Rb_tree_node_base *)MVar3,(_Rb_tree_node_base *)(pMVar18 + 1))
                  ;
                  pMVar18[5] = (MaxInt<unsigned_int>)((long)pMVar18[5] + -1);
                  bVar6 = true;
                  if (&local_158._M_impl.super__Rb_tree_header != (_Rb_tree_header *)p_Var16 &&
                      pVar21.first == (_Rb_tree_node_base *)0x0) {
                    bVar6 = DuplicateKeyCheck<(anonymous_namespace)::KeyParser>::Comp::operator()
                                      ((Comp *)&local_158,(uint *)((long)this + 0x20),
                                       &p_Var16[1]._M_color);
                  }
                  std::_Rb_tree_insert_and_rebalance
                            (bVar6,(_Rb_tree_node_base *)this,(_Rb_tree_node_base *)p_Var16,
                             (_Rb_tree_node_base *)&local_158._M_impl.super__Rb_tree_header);
                  local_158._M_impl.super__Rb_tree_header._M_node_count =
                       local_158._M_impl.super__Rb_tree_header._M_node_count + 1;
                }
              }
              MVar17 = (MaxInt<unsigned_int>)((long)MVar17 + (long)MVar2);
              if ((MaxInt<unsigned_int>)local_158._M_impl.super__Rb_tree_header._M_node_count !=
                  MVar17) goto LAB_0071f722;
              pMVar18 = pMVar18 + 7;
            } while (pMVar18 != (MaxInt<unsigned_int> *)poVar4);
          }
          *(undefined2 *)(lVar9 + 0xa0) = 0x100;
          local_70 = (MaxInt<unsigned_int>)
                     local_158._M_impl.super__Rb_tree_key_compare<Comp>._M_key_compare.ctx_ptr;
          if ((MaxInt<unsigned_int>)local_158._M_impl.super__Rb_tree_header._M_header._M_parent ==
              (MaxInt<unsigned_int>)0x0) {
            local_68[0] = _S_red;
            local_60.valid = false;
            local_60._1_3_ = 0;
            local_60.value = 0;
            local_58 = (MaxInt<unsigned_int>)local_68;
            pMVar18 = &local_48;
            MStack_50 = local_58;
          }
          else {
            local_68[0] = local_158._M_impl.super__Rb_tree_header._M_header._M_color;
            local_60 = (MaxInt<unsigned_int>)
                       local_158._M_impl.super__Rb_tree_header._M_header._M_parent;
            local_58 = (MaxInt<unsigned_int>)
                       local_158._M_impl.super__Rb_tree_header._M_header._M_left;
            MStack_50 = (MaxInt<unsigned_int>)
                        local_158._M_impl.super__Rb_tree_header._M_header._M_right;
            *(_Rb_tree_color **)
             &((_Rb_tree_header *)
              ((long)local_158._M_impl.super__Rb_tree_header._M_header._M_parent + 8))->_M_header =
                 local_68;
            local_48.valid = (bool)(undefined1)local_158._M_impl.super__Rb_tree_header._M_node_count
            ;
            local_48._1_3_ = local_158._M_impl.super__Rb_tree_header._M_node_count._1_3_;
            local_48.value = local_158._M_impl.super__Rb_tree_header._M_node_count._4_4_;
            local_158._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            local_158._M_impl.super__Rb_tree_header._M_header._M_left =
                 &local_158._M_impl.super__Rb_tree_header._M_header;
            pMVar18 = (MaxInt<unsigned_int> *)&local_158._M_impl.super__Rb_tree_header._M_node_count
            ;
            local_158._M_impl.super__Rb_tree_header._M_header._M_right =
                 local_158._M_impl.super__Rb_tree_header._M_header._M_left;
          }
          pMVar18->valid = false;
          *(undefined3 *)&pMVar18->field_0x1 = 0;
          pMVar18->value = 0;
          local_40 = '\x01';
        }
        else {
LAB_0071f722:
          *(undefined2 *)(lVar9 + 0xa0) = 0x101;
          local_40 = '\0';
        }
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_Comp,_std::allocator<unsigned_int>_>
        ::_M_erase((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_Comp,_std::allocator<unsigned_int>_>
                    *)local_158._M_impl.super__Rb_tree_header._M_header._M_parent,(_Link_type)this);
      }
      local_80 = '\0';
      if (local_40 == '\x01') {
        local_b0 = local_70;
        if (local_60 == (MaxInt<unsigned_int>)0x0) {
          local_a8[0] = _S_red;
          local_a0.valid = false;
          local_a0._1_3_ = 0;
          local_a0.value = 0;
          local_98 = (MaxInt<unsigned_int>)local_a8;
          pMVar18 = &local_88;
          MStack_90 = local_98;
        }
        else {
          local_a8[0] = local_68[0];
          local_a0 = local_60;
          local_98 = local_58;
          MStack_90 = MStack_50;
          *(_Rb_tree_color **)&((_Rb_tree_header *)((long)local_60 + 8))->_M_header = local_a8;
          local_88 = local_48;
          local_60.valid = false;
          local_60._1_3_ = 0;
          local_60.value = 0;
          local_58 = (MaxInt<unsigned_int>)local_68;
          pMVar18 = &local_48;
          MStack_50 = local_58;
        }
        pMVar18->valid = false;
        *(undefined3 *)&pMVar18->field_0x1 = 0;
        pMVar18->value = 0;
        local_80 = '\x01';
        local_78 = '\x01';
        local_40 = '\0';
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_Comp,_std::allocator<unsigned_int>_>
        ::_M_erase((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_Comp,_std::allocator<unsigned_int>_>
                    *)local_60,(_Link_type)this);
      }
      else {
        local_78 = '\x01';
      }
      poVar4 = local_198.
               super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (local_78 == '\0') {
        local_b8 = '\0';
        bVar6 = true;
      }
      else {
        lVar9 = *(long *)(lVar9 + 0x40) - *(long *)(lVar9 + 0x38) >> 4;
        pMVar18 = (MaxInt<unsigned_int> *)
                  local_198.
                  super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (lVar9 * -0x38 != 0) {
          pMVar18 = (MaxInt<unsigned_int> *)
                    ((long)local_198.
                           super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish + lVar9 * -7 * 8);
          pMVar19 = pMVar18;
          do {
            if (pMVar19[6].valid == true) {
              pMVar19[6].valid = false;
              std::
              _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_Comp,_std::allocator<unsigned_int>_>
              ::_M_erase((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_Comp,_std::allocator<unsigned_int>_>
                          *)pMVar19[2],(_Link_type)this);
            }
            pMVar19 = pMVar19 + 7;
          } while (pMVar19 != (MaxInt<unsigned_int> *)poVar4);
        }
        local_198.
        super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)pMVar18;
        poVar5 = local_198.
                 super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        poVar4 = local_198.
                 super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (local_198.
            super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_198.
            super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          if ((long)local_198.
                    super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_198.
                    super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start == 0x7ffffffffffffff8) {
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              std::__throw_length_error("vector::_M_realloc_insert");
LAB_0071fe18:
              __assert_fail("results.size() == 1",
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.h"
                            ,0x27e,
                            "std::optional<Result> miniscript::Node<unsigned int>::TreeEvalMaybe(State, DownFn, UpFn) const [Key = unsigned int, Result = std::optional<std::set<unsigned int, Comp>>, State = DummyState, DownFn = (lambda at /workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.h:678:13), UpFn = (lambda at /workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.h:679:13)]"
                           );
            }
            goto LAB_0071fed1;
          }
          lVar9 = (long)local_198.
                        super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_198.
                        super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3;
          uVar13 = lVar9 * 0x6db6db6db6db6db7;
          uVar10 = uVar13;
          if (local_198.
              super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_198.
              super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            uVar10 = 1;
          }
          uVar20 = uVar10 + uVar13;
          if (0x249249249249248 < uVar20) {
            uVar20 = 0x249249249249249;
          }
          if (CARRY8(uVar10,uVar13)) {
            uVar20 = 0x249249249249249;
          }
          if (uVar20 == 0) {
            pMVar18 = (MaxInt<unsigned_int> *)0x0;
          }
          else {
            pMVar18 = (MaxInt<unsigned_int> *)operator_new(uVar20 * 0x38);
          }
          pMVar18[lVar9 + 6].valid = false;
          pMVar19 = pMVar18;
          pMVar1 = (MaxInt<unsigned_int> *)poVar4;
          if (local_80 == '\x01') {
            pMVar11 = pMVar18 + lVar9;
            *pMVar11 = local_b0;
            MVar2 = (MaxInt<unsigned_int>)(pMVar11 + 1);
            if (local_a0 == (MaxInt<unsigned_int>)0x0) {
              *(undefined4 *)(pMVar11 + 1) = 0;
              pMVar11[2].valid = false;
              *(undefined3 *)&pMVar11[2].field_0x1 = 0;
              pMVar11[2].value = 0;
              pMVar11[3] = MVar2;
              pMVar11[4] = MVar2;
              pMVar12 = pMVar11 + 5;
            }
            else {
              this._4_4_ = 0;
              this._0_4_ = local_a8[0];
              *(_Rb_tree_color *)(pMVar11 + 1) = local_a8[0];
              pMVar11[2] = local_a0;
              pMVar11[3] = local_98;
              pMVar11[4] = MStack_90;
              *(MaxInt<unsigned_int> *)((long)local_a0 + 8) = MVar2;
              pMVar11[5] = local_88;
              local_a0.valid = false;
              local_a0._1_3_ = 0;
              local_a0.value = 0;
              local_98 = (MaxInt<unsigned_int>)local_a8;
              pMVar12 = &local_88;
              MStack_90 = local_98;
            }
            pMVar12->valid = false;
            *(undefined3 *)&pMVar12->field_0x1 = 0;
            pMVar12->value = 0;
            pMVar11[6].valid = true;
          }
          for (; (MaxInt<unsigned_int> *)poVar5 != pMVar1; pMVar1 = pMVar1 + 7) {
            pMVar19[6].valid = false;
            if (pMVar1[6].valid == true) {
              *pMVar19 = *pMVar1;
              this = (Node<unsigned_int> *)(pMVar1 + 1);
              std::_Rb_tree_header::_Rb_tree_header
                        ((_Rb_tree_header *)(pMVar19 + 1),(_Rb_tree_header *)this);
              pMVar19[6].valid = true;
            }
            if (pMVar1[6].valid == true) {
              pMVar1[6].valid = false;
              std::
              _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_Comp,_std::allocator<unsigned_int>_>
              ::_M_erase((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_Comp,_std::allocator<unsigned_int>_>
                          *)pMVar1[2],(_Link_type)this);
            }
            pMVar19 = pMVar19 + 7;
          }
          if ((MaxInt<unsigned_int> *)poVar4 != (MaxInt<unsigned_int> *)0x0) {
            this = (Node<unsigned_int> *)
                   ((long)local_198.
                          super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)poVar4);
            operator_delete(poVar4,(ulong)this);
          }
          local_198.
          super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pMVar18 + uVar20 * 7);
          local_198.
          super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)pMVar18;
          local_198.
          super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)pMVar19;
        }
        else {
          ((MaxInt<unsigned_int> *)
          ((long)local_198.
                 super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 0x30))->valid = false;
          if (local_80 == '\x01') {
            *(MaxInt<unsigned_int> *)
             local_198.
             super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish = local_b0;
            MVar2 = (MaxInt<unsigned_int>)
                    ((long)local_198.
                           super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish + 8);
            if (local_a0 == (MaxInt<unsigned_int>)0x0) {
              *(undefined4 *)
               ((long)local_198.
                      super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish + 8) = 0;
              *(bool *)((long)&((local_198.
                                 super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish)->
                               super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                               )._M_payload.
                               super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                               .
                               super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                               ._M_payload + 0x10) = false;
              *(undefined3 *)
               ((long)&((local_198.
                         super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish)->
                       super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                       )._M_payload.
                       super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                       ._M_payload + 0x11) = 0;
              *(uint *)((long)&((local_198.
                                 super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish)->
                               super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                               )._M_payload.
                               super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                               .
                               super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                               ._M_payload + 0x14) = 0;
              *(MaxInt<unsigned_int> *)
               ((long)local_198.
                      super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish + 0x18) = MVar2;
              *(MaxInt<unsigned_int> *)
               ((long)local_198.
                      super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish + 0x20) = MVar2;
              pMVar18 = (MaxInt<unsigned_int> *)
                        ((long)local_198.
                               super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish + 0x28);
            }
            else {
              *(_Rb_tree_color *)
               ((long)local_198.
                      super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish + 8) = local_a8[0];
              *(MaxInt<unsigned_int> *)
               ((long)local_198.
                      super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish + 0x10) = local_a0;
              *(MaxInt<unsigned_int> *)
               ((long)local_198.
                      super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish + 0x18) = local_98;
              *(MaxInt<unsigned_int> *)
               ((long)local_198.
                      super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish + 0x20) = MStack_90;
              *(MaxInt<unsigned_int> *)((long)local_a0 + 8) = MVar2;
              *(MaxInt<unsigned_int> *)
               ((long)local_198.
                      super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish + 0x28) = local_88;
              local_a0.valid = false;
              local_a0._1_3_ = 0;
              local_a0.value = 0;
              local_98 = (MaxInt<unsigned_int>)local_a8;
              pMVar18 = &local_88;
              MStack_90 = local_98;
            }
            pMVar18->valid = false;
            *(undefined3 *)&pMVar18->field_0x1 = 0;
            pMVar18->value = 0;
            ((MaxInt<unsigned_int> *)
            ((long)local_198.
                   super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 0x30))->valid = true;
          }
        }
        local_198.
        super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)((long)local_198.
                             super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish + 0x38);
        pvStack_170 = (void *)((long)pvStack_170 + -0x18);
        bVar6 = false;
      }
      if ((local_78 == '\x01') && (local_78 = '\0', local_80 == '\x01')) {
        local_80 = '\0';
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_Comp,_std::allocator<unsigned_int>_>
        ::_M_erase((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_Comp,_std::allocator<unsigned_int>_>
                    *)local_a0,(_Link_type)this);
      }
    }
  } while (!bVar6);
  std::
  vector<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
  ::~vector(&local_198);
  if (local_178 != (void *)0x0) {
    this = (Node<unsigned_int> *)(local_168 - (long)local_178);
    operator_delete(local_178,(ulong)this);
  }
  local_f8 = '\0';
  if (local_c0 == '\x01') {
    local_128 = local_f0;
    if (local_e0 == (MaxInt<unsigned_int>)0x0) {
      pMVar18 = &local_100;
      local_120[0] = 0;
      local_118.valid = false;
      local_118._1_3_ = 0;
      local_118.value = 0;
      this = (Node<unsigned_int> *)local_f0;
      local_110 = (MaxInt<unsigned_int>)local_120;
      MStack_108 = (MaxInt<unsigned_int>)local_120;
    }
    else {
      local_120[0] = local_e8[0];
      local_118 = local_e0;
      local_110 = local_d8;
      MStack_108 = MStack_d0;
      *(undefined4 **)((long)local_e0 + 8) = local_120;
      pMVar18 = &local_c8;
      local_100 = local_c8;
      local_e0.valid = false;
      local_e0._1_3_ = 0;
      local_e0.value = 0;
      this = (Node<unsigned_int> *)local_e8;
      local_d8 = (MaxInt<unsigned_int>)local_e8;
      MStack_d0 = (MaxInt<unsigned_int>)local_e8;
    }
    pMVar18->valid = false;
    *(undefined3 *)&pMVar18->field_0x1 = 0;
    pMVar18->value = 0;
    local_f8 = '\x01';
  }
  if ((local_b8 == '\x01') && (local_b8 = '\0', local_c0 != '\0')) {
    local_c0 = '\0';
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_Comp,_std::allocator<unsigned_int>_>
    ::_M_erase((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_Comp,_std::allocator<unsigned_int>_>
                *)local_e0,(_Link_type)this);
  }
  if (local_f8 == '\x01') {
    local_f8 = '\0';
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_Comp,_std::allocator<unsigned_int>_>
    ::_M_erase((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_Comp,_std::allocator<unsigned_int>_>
                *)local_118,(_Link_type)this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_0071fed1:
  __stack_chk_fail();
}

Assistant:

void DuplicateKeyCheck(const Ctx& ctx) const
    {
        // We cannot use a lambda here, as lambdas are non assignable, and the set operations
        // below require moving the comparators around.
        struct Comp {
            const Ctx* ctx_ptr;
            Comp(const Ctx& ctx) : ctx_ptr(&ctx) {}
            bool operator()(const Key& a, const Key& b) const { return ctx_ptr->KeyCompare(a, b); }
        };

        // state in the recursive computation:
        // - std::nullopt means "this node has duplicates"
        // - an std::set means "this node has no duplicate keys, and they are: ...".
        using keyset = std::set<Key, Comp>;
        using state = std::optional<keyset>;

        auto upfn = [&ctx](const Node& node, Span<state> subs) -> state {
            // If this node is already known to have duplicates, nothing left to do.
            if (node.has_duplicate_keys.has_value() && *node.has_duplicate_keys) return {};

            // Check if one of the children is already known to have duplicates.
            for (auto& sub : subs) {
                if (!sub.has_value()) {
                    node.has_duplicate_keys = true;
                    return {};
                }
            }

            // Start building the set of keys involved in this node and children.
            // Start by keys in this node directly.
            size_t keys_count = node.keys.size();
            keyset key_set{node.keys.begin(), node.keys.end(), Comp(ctx)};
            if (key_set.size() != keys_count) {
                // It already has duplicates; bail out.
                node.has_duplicate_keys = true;
                return {};
            }

            // Merge the keys from the children into this set.
            for (auto& sub : subs) {
                keys_count += sub->size();
                // Small optimization: std::set::merge is linear in the size of the second arg but
                // logarithmic in the size of the first.
                if (key_set.size() < sub->size()) std::swap(key_set, *sub);
                key_set.merge(*sub);
                if (key_set.size() != keys_count) {
                    node.has_duplicate_keys = true;
                    return {};
                }
            }

            node.has_duplicate_keys = false;
            return key_set;
        };

        TreeEval<state>(upfn);
    }